

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  HavingToWhereCtx *pHVar1;
  sqlite3 *db_00;
  int iVar2;
  Expr *pEVar3;
  undefined1 local_88 [8];
  Expr t;
  Expr *pWhere;
  Expr *pNew;
  sqlite3 *db;
  HavingToWhereCtx *p;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (pExpr->op == 'G') {
    pWalker_local._4_4_ = 0;
  }
  else {
    pHVar1 = (pWalker->u).pHavingCtx;
    iVar2 = sqlite3ExprIsConstantOrGroupBy(pWalker->pParse,pExpr,pHVar1->pGroupBy);
    if (iVar2 != 0) {
      db_00 = pWalker->pParse->db;
      pEVar3 = sqlite3ExprAlloc(db_00,0x86,sqlite3IntTokens + 1,0);
      if (pEVar3 != (Expr *)0x0) {
        t.pTab = (Table *)*pHVar1->ppWhere;
        memcpy(local_88,pEVar3,0x48);
        memcpy(pEVar3,pExpr,0x48);
        memcpy(pExpr,local_88,0x48);
        pEVar3 = sqlite3ExprAnd(db_00,(Expr *)t.pTab,pEVar3);
        *pHVar1->ppWhere = pEVar3;
      }
    }
    pWalker_local._4_4_ = 1;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    struct HavingToWhereCtx *p = pWalker->u.pHavingCtx;
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, p->pGroupBy) ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[1], 0);
      if( pNew ){
        Expr *pWhere = *(p->ppWhere);
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(db, pWhere, pNew);
        *(p->ppWhere) = pNew;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}